

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

cram_file_def * cram_read_file_def(cram_fd *fd)

{
  hFILE *fp;
  char *__src;
  cram_file_def *__dest;
  size_t __n;
  ulong uVar1;
  
  __dest = (cram_file_def *)malloc(0x1a);
  if (__dest != (cram_file_def *)0x0) {
    fp = fd->fp;
    __src = fp->begin;
    uVar1 = (long)fp->end - (long)__src;
    __n = 0x1a;
    if (uVar1 < 0x1a) {
      __n = uVar1;
    }
    memcpy(__dest,__src,__n);
    fp->begin = __src + __n;
    if (uVar1 < 0x1a) {
      __n = hread2(fp,__dest,0x1a,__n);
    }
    if ((__n == 0x1a) && (*(int *)__dest->magic == 0x4d415243)) {
      if (__dest->major_version < 4) {
        fd->first_container = fd->first_container + 0x1a;
        fd->last_slice = 0;
        return __dest;
      }
      cram_read_file_def_cold_1();
    }
    else {
      free(__dest);
    }
  }
  return (cram_file_def *)0x0;
}

Assistant:

cram_file_def *cram_read_file_def(cram_fd *fd) {
    cram_file_def *def = malloc(sizeof(*def));
    if (!def)
	return NULL;

    if (26 != hread(fd->fp, &def->magic[0], 26)) {
	free(def);
	return NULL;
    }

    if (memcmp(def->magic, "CRAM", 4) != 0) {
	free(def);
	return NULL;
    }

    if (def->major_version > 3) {
	fprintf(stderr, "CRAM version number mismatch\n"
		"Expected 1.x, 2.x or 3.x, got %d.%d\n",
		def->major_version, def->minor_version);
	free(def);
	return NULL;
    }

    fd->first_container += 26;
    fd->last_slice = 0;

    return def;
}